

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

VkDeviceSize
vkt::memory::anon_unknown_0::findMaxBufferSize
          (DeviceInterface *vkd,VkDevice device,VkBufferUsageFlags usage,VkSharingMode sharingMode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies,VkDeviceSize memorySize
          ,deUint32 memoryTypeIndex)

{
  VkAllocationCallbacks *pVVar1;
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  Handle<(vk::HandleType)8> *pHVar2;
  bool bVar3;
  undefined1 local_160 [8];
  VkMemoryRequirements requirements_1;
  RefData<vk::Handle<(vk::HandleType)8>_> local_128;
  undefined1 local_108 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> buffer_1;
  VkDeviceSize stepSize;
  undefined1 local_d0 [8];
  VkMemoryRequirements requirements;
  Move<vk::Handle<(vk::HandleType)8>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> buffer;
  VkDeviceSize currentSize;
  VkDeviceSize lastSuccess;
  VkDeviceSize memorySize_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies_local;
  VkSharingMode sharingMode_local;
  VkBufferUsageFlags usage_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  currentSize = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)(memorySize >> 1);
  createBuffer(&local_a8,vkd,device,memorySize,usage,sharingMode,queueFamilies);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface = local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator = local_88.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_a8);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_68);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_d0,vkd,device,(VkBuffer)pHVar2->m_internal);
  if ((local_d0 == (undefined1  [8])memorySize) &&
     (((uint)requirements.alignment & 1 << ((byte)memoryTypeIndex & 0x1f)) != 0)) {
    bVar3 = true;
    vkd_local = (DeviceInterface *)memorySize;
  }
  else {
    bVar3 = false;
  }
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_68);
  if (!bVar3) {
    buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)(memorySize >> 2);
    while (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator !=
           (VkAllocationCallbacks *)0x0) {
      createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&requirements_1.memoryTypeBits,vkd,device
                   ,(VkDeviceSize)
                    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
                   usage,sharingMode,queueFamilies);
      ::vk::refdetails::Move::operator_cast_to_RefData
                (&local_128,(Move *)&requirements_1.memoryTypeBits);
      data_00.deleter.m_deviceIface = local_128.deleter.m_deviceIface;
      data_00.object.m_internal = local_128.object.m_internal;
      data_00.deleter.m_device = local_128.deleter.m_device;
      data_00.deleter.m_allocator = local_128.deleter.m_allocator;
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
                ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_108,data_00);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)8>_> *)&requirements_1.memoryTypeBits);
      pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_108);
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)local_160,vkd,device,(VkBuffer)pHVar2->m_internal);
      if ((memorySize < (ulong)local_160) ||
         (((uint)requirements_1.alignment & 1 << ((byte)memoryTypeIndex & 0x1f)) == 0)) {
        pVVar1 = (VkAllocationCallbacks *)
                 -(long)buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator;
      }
      else {
        currentSize = (VkDeviceSize)
                      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator;
        pVVar1 = buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
      }
      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           ((long)&(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator)
                   ->pUserData + (long)&pVVar1->pUserData);
      bVar3 = buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator ==
              (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_108);
      if (bVar3) break;
      buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           ((ulong)buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
           >> 1);
    }
    vkd_local = (DeviceInterface *)currentSize;
  }
  return (VkDeviceSize)vkd_local;
}

Assistant:

vk::VkDeviceSize findMaxBufferSize (const vk::DeviceInterface&		vkd,
									vk::VkDevice					device,

									vk::VkBufferUsageFlags			usage,
									vk::VkSharingMode				sharingMode,
									const vector<deUint32>&			queueFamilies,

									vk::VkDeviceSize				memorySize,
									deUint32						memoryTypeIndex)
{
	vk::VkDeviceSize	lastSuccess	= 0;
	vk::VkDeviceSize	currentSize	= memorySize / 2;

	{
		const vk::Unique<vk::VkBuffer>  buffer			(createBuffer(vkd, device, memorySize, usage, sharingMode, queueFamilies));
		const vk::VkMemoryRequirements  requirements	(vk::getBufferMemoryRequirements(vkd, device, *buffer));

		if (requirements.size == memorySize && requirements.memoryTypeBits & (0x1u << memoryTypeIndex))
			return memorySize;
	}

	for (vk::VkDeviceSize stepSize = memorySize / 4; currentSize > 0; stepSize /= 2)
	{
		const vk::Unique<vk::VkBuffer>	buffer			(createBuffer(vkd, device, currentSize, usage, sharingMode, queueFamilies));
		const vk::VkMemoryRequirements	requirements	(vk::getBufferMemoryRequirements(vkd, device, *buffer));

		if (requirements.size <= memorySize && requirements.memoryTypeBits & (0x1u << memoryTypeIndex))
		{
			lastSuccess = currentSize;
			currentSize += stepSize;
		}
		else
			currentSize -= stepSize;

		if (stepSize == 0)
			break;
	}

	return lastSuccess;
}